

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

TestCaseGroup * vkt::image::createImageLoadStoreTests(TestContext *testCtx)

{
  VkFormat format;
  TestCaseGroup *pTVar1;
  LoadStoreTest *pLVar2;
  long lVar3;
  ImageType imageType;
  ImageType imageType_00;
  VkFormat format_00;
  VkFormat format_01;
  VkFormat format_02;
  long lVar4;
  allocator<char> local_109;
  Texture *local_108;
  int local_fc;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
  groupWithFormatByImageViewType;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
  groupWithoutFormatByImageViewType;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroupWithoutFormat;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroupWithFormat;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  string local_90;
  string local_70;
  string local_50;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,testCtx,"load_store","Cases with imageLoad() followed by imageStore()");
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar1;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,testCtx,"with_format","Declare a format layout qualifier for read images");
  testGroupWithFormat.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,testCtx,"without_format",
             "Do not declare a format layout qualifier for read images");
  testGroupWithoutFormat.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar1;
  for (lVar4 = 0;
      pTVar1 = testGroupWithFormat.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar4 != 8; lVar4 = lVar4 + 1) {
    pTVar1 = (TestCaseGroup *)operator_new(0x70);
    local_108 = (Texture *)((anonymous_namespace)::s_textures + lVar4 * 0x18);
    getImageTypeName_abi_cxx11_
              (&local_90,
               (image *)(ulong)*(uint *)((anonymous_namespace)::s_textures + lVar4 * 0x18 + 0xc),
               imageType);
    tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,local_90._M_dataplus._M_p,"");
    groupWithFormatByImageViewType.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         pTVar1;
    std::__cxx11::string::~string((string *)&local_90);
    pTVar1 = (TestCaseGroup *)operator_new(0x70);
    getImageTypeName_abi_cxx11_(&local_90,(image *)(ulong)local_108->m_type,imageType_00);
    tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,local_90._M_dataplus._M_p,"");
    groupWithoutFormatByImageViewType.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         pTVar1;
    std::__cxx11::string::~string((string *)&local_90);
    local_fc = local_108->m_numLayers;
    for (lVar3 = 0;
        pTVar1 = groupWithFormatByImageViewType.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar3 != 0x34; lVar3 = lVar3 + 4) {
      pLVar2 = (LoadStoreTest *)operator_new(0x98);
      format = *(VkFormat *)((long)&(anonymous_namespace)::s_formats + lVar3);
      getFormatShortString_abi_cxx11_(&local_90,(image *)(ulong)format,format_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"",(allocator<char> *)&local_50);
      anon_unknown_0::LoadStoreTest::LoadStoreTest
                (pLVar2,testCtx,&local_90,&local_70,local_108,format,format,4);
      tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar2);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      pTVar1 = groupWithoutFormatByImageViewType.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      pLVar2 = (LoadStoreTest *)operator_new(0x98);
      getFormatShortString_abi_cxx11_(&local_90,(image *)(ulong)format,format_01);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"",(allocator<char> *)&local_50);
      anon_unknown_0::LoadStoreTest::LoadStoreTest
                (pLVar2,testCtx,&local_90,&local_70,local_108,format,format,0);
      tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar2);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      pTVar1 = groupWithFormatByImageViewType.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      if (1 < local_fc) {
        pLVar2 = (LoadStoreTest *)operator_new(0x98);
        getFormatShortString_abi_cxx11_(&local_70,(image *)(ulong)format,format_02);
        std::operator+(&local_90,&local_70,"_single_layer");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_109);
        anon_unknown_0::LoadStoreTest::LoadStoreTest
                  (pLVar2,testCtx,&local_90,&local_50,local_108,format,format,5);
        tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar2);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    groupWithFormatByImageViewType.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(testGroupWithFormat.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar1->super_TestNode);
    pTVar1 = groupWithoutFormatByImageViewType.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    groupWithoutFormatByImageViewType.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(testGroupWithoutFormat.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar1->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&groupWithoutFormatByImageViewType.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&groupWithFormatByImageViewType.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  }
  testGroupWithFormat.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(testGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  pTVar1 = testGroupWithoutFormat.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  testGroupWithoutFormat.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(testGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  pTVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&testGroupWithoutFormat.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&testGroupWithFormat.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&testGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createImageLoadStoreTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "load_store", "Cases with imageLoad() followed by imageStore()"));
	de::MovePtr<tcu::TestCaseGroup> testGroupWithFormat(new tcu::TestCaseGroup(testCtx, "with_format", "Declare a format layout qualifier for read images"));
	de::MovePtr<tcu::TestCaseGroup> testGroupWithoutFormat(new tcu::TestCaseGroup(testCtx, "without_format", "Do not declare a format layout qualifier for read images"));

	for (int textureNdx = 0; textureNdx < DE_LENGTH_OF_ARRAY(s_textures); ++textureNdx)
	{
		const Texture& texture = s_textures[textureNdx];
		de::MovePtr<tcu::TestCaseGroup> groupWithFormatByImageViewType (new tcu::TestCaseGroup(testCtx, getImageTypeName(texture.type()).c_str(), ""));
		de::MovePtr<tcu::TestCaseGroup> groupWithoutFormatByImageViewType (new tcu::TestCaseGroup(testCtx, getImageTypeName(texture.type()).c_str(), ""));
		const bool isLayered = (texture.numLayers() > 1);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(s_formats); ++formatNdx)
		{
			groupWithFormatByImageViewType->addChild(new LoadStoreTest(testCtx, getFormatShortString(s_formats[formatNdx]), "", texture, s_formats[formatNdx], s_formats[formatNdx]));
			groupWithoutFormatByImageViewType->addChild(new LoadStoreTest(testCtx, getFormatShortString(s_formats[formatNdx]), "", texture, s_formats[formatNdx], s_formats[formatNdx], 0));

			if (isLayered)
				groupWithFormatByImageViewType->addChild(new LoadStoreTest(testCtx, getFormatShortString(s_formats[formatNdx]) + "_single_layer", "",
														texture, s_formats[formatNdx], s_formats[formatNdx],
														LoadStoreTest::FLAG_SINGLE_LAYER_BIND | LoadStoreTest::FLAG_DECLARE_IMAGE_FORMAT_IN_SHADER));
		}

		testGroupWithFormat->addChild(groupWithFormatByImageViewType.release());
		testGroupWithoutFormat->addChild(groupWithoutFormatByImageViewType.release());
	}

	testGroup->addChild(testGroupWithFormat.release());
	testGroup->addChild(testGroupWithoutFormat.release());

	return testGroup.release();
}